

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_DCtx_setParameter(ZSTD_DCtx *dctx,ZSTD_dParameter dParam,int value)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int local_18;
  ZSTD_dParameter dParam_00;
  size_t local_8;
  
  if (*(int *)(in_RDI + 0x761c) == 0) {
    dParam_00 = (ZSTD_dParameter)in_RDI;
    if (in_ESI == 100) {
      local_18 = in_EDX;
      if (in_EDX == 0) {
        local_18 = 0x1b;
      }
      iVar1 = ZSTD_dParam_withinBounds(dParam_00,100);
      if (iVar1 == 0) {
        local_8 = 0xffffffffffffffd6;
      }
      else {
        *(long *)(in_RDI + 0x7638) = 1L << ((byte)local_18 & 0x3f);
        local_8 = 0;
      }
    }
    else if (in_ESI == 1000) {
      iVar1 = ZSTD_dParam_withinBounds(dParam_00,1000);
      if (iVar1 == 0) {
        local_8 = 0xffffffffffffffd6;
      }
      else {
        *(int *)(in_RDI + 0x7598) = in_EDX;
        local_8 = 0;
      }
    }
    else if (in_ESI == 0x3e9) {
      iVar1 = ZSTD_dParam_withinBounds(dParam_00,0x3e9);
      if (iVar1 == 0) {
        local_8 = 0xffffffffffffffd6;
      }
      else {
        *(int *)(in_RDI + 0x7670) = in_EDX;
        local_8 = 0;
      }
    }
    else if (in_ESI == 0x3ea) {
      iVar1 = ZSTD_dParam_withinBounds(dParam_00,0x3ea);
      if (iVar1 == 0) {
        local_8 = 0xffffffffffffffd6;
      }
      else {
        *(int *)(in_RDI + 0x759c) = in_EDX;
        local_8 = 0;
      }
    }
    else if (in_ESI == 0x3eb) {
      iVar1 = ZSTD_dParam_withinBounds(dParam_00,0x3eb);
      if (iVar1 == 0) {
        local_8 = 0xffffffffffffffd6;
      }
      else if (*(long *)(in_RDI + 0x75d8) == 0) {
        *(int *)(in_RDI + 0x7610) = in_EDX;
        local_8 = 0;
      }
      else {
        local_8 = 0xffffffffffffffd8;
      }
    }
    else if (in_ESI == 0x3ec) {
      iVar1 = ZSTD_dParam_withinBounds(dParam_00,0x3ec);
      if (iVar1 == 0) {
        local_8 = 0xffffffffffffffd6;
      }
      else {
        *(uint *)(in_RDI + 0x7614) = (uint)(in_EDX != 0);
        local_8 = 0;
      }
    }
    else if (in_ESI == 0x3ed) {
      if ((in_EDX == 0) || (iVar1 = ZSTD_dParam_withinBounds(dParam_00,0x3ed), iVar1 != 0)) {
        *(int *)(in_RDI + 0x7618) = in_EDX;
        local_8 = 0;
      }
      else {
        local_8 = 0xffffffffffffffd6;
      }
    }
    else {
      local_8 = 0xffffffffffffffd8;
    }
  }
  else {
    local_8 = 0xffffffffffffffc4;
  }
  return local_8;
}

Assistant:

size_t ZSTD_DCtx_setParameter(ZSTD_DCtx* dctx, ZSTD_dParameter dParam, int value)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    switch(dParam) {
        case ZSTD_d_windowLogMax:
            if (value == 0) value = ZSTD_WINDOWLOG_LIMIT_DEFAULT;
            CHECK_DBOUNDS(ZSTD_d_windowLogMax, value);
            dctx->maxWindowSize = ((size_t)1) << value;
            return 0;
        case ZSTD_d_format:
            CHECK_DBOUNDS(ZSTD_d_format, value);
            dctx->format = (ZSTD_format_e)value;
            return 0;
        case ZSTD_d_stableOutBuffer:
            CHECK_DBOUNDS(ZSTD_d_stableOutBuffer, value);
            dctx->outBufferMode = (ZSTD_bufferMode_e)value;
            return 0;
        case ZSTD_d_forceIgnoreChecksum:
            CHECK_DBOUNDS(ZSTD_d_forceIgnoreChecksum, value);
            dctx->forceIgnoreChecksum = (ZSTD_forceIgnoreChecksum_e)value;
            return 0;
        case ZSTD_d_refMultipleDDicts:
            CHECK_DBOUNDS(ZSTD_d_refMultipleDDicts, value);
            if (dctx->staticSize != 0) {
                RETURN_ERROR(parameter_unsupported, "Static dctx does not support multiple DDicts!");
            }
            dctx->refMultipleDDicts = (ZSTD_refMultipleDDicts_e)value;
            return 0;
        case ZSTD_d_disableHuffmanAssembly:
            CHECK_DBOUNDS(ZSTD_d_disableHuffmanAssembly, value);
            dctx->disableHufAsm = value != 0;
            return 0;
        case ZSTD_d_maxBlockSize:
            if (value != 0) CHECK_DBOUNDS(ZSTD_d_maxBlockSize, value);
            dctx->maxBlockSizeParam = value;
            return 0;
        default:;
    }
    RETURN_ERROR(parameter_unsupported, "");
}